

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O1

RK_S32 mpi_enc_opt_bps(void *ctx,char *next)

{
  int iVar1;
  
  if ((next != (char *)0x0) &&
     (iVar1 = __isoc99_sscanf(next,"%d:%d:%d",(long)ctx + 0x4c,(long)ctx + 0x54,(long)ctx + 0x50),
     iVar1 != 0)) {
    return 1;
  }
  _mpp_log_l(2,"mpi_enc_utils","invalid bit rate usage -bps bps_target:bps_min:bps_max\n",0);
  return 0;
}

Assistant:

RK_S32 mpi_enc_opt_bps(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;
    RK_S32 cnt = 0;

    if (next) {
        cnt = sscanf(next, "%d:%d:%d",
                     &cmd->bps_target, &cmd->bps_min, &cmd->bps_max);
        if (cnt)
            return 1;
    }

    mpp_err("invalid bit rate usage -bps bps_target:bps_min:bps_max\n");
    return 0;
}